

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O3

void __thiscall pg::PTLSolver::run(PTLSolver *this)

{
  bitset *this_00;
  uint64_t *puVar1;
  pointer ppiVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong *puVar8;
  int *piVar9;
  ulong uVar10;
  uint *puVar11;
  uint *puVar12;
  ostream *poVar13;
  ulong uVar14;
  Game *pGVar15;
  long lVar16;
  int **x;
  pointer ppiVar17;
  pointer *ppiVar18;
  
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  uVar10 = ((this->super_Solver).game)->n_vertices;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar10;
  uVar7 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar14 = uVar7 + 8;
  if (0xfffffffffffffff7 < uVar7) {
    uVar14 = 0xffffffffffffffff;
  }
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar8 = (ulong *)operator_new__(uVar14);
  *puVar8 = uVar10;
  if (uVar10 != 0) {
    memset((vector<int,_std::allocator<int>_> *)(puVar8 + 1),0,((uVar7 - 0x18) / 0x18) * 0x18 + 0x18
          );
  }
  this->tin = (vector<int,_std::allocator<int>_> *)(puVar8 + 1);
  piVar9 = (int *)operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | uVar10 << 2);
  this->str = piVar9;
  bitset::resize(&this->H,uVar10);
  bitset::resize(&this->S0,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->S1,((this->super_Solver).game)->n_vertices);
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  if ((this->G)._bitssize == 0) {
    uVar10 = 0;
  }
  else {
    puVar1 = this_00->_bits;
    uVar7 = 0;
    do {
      puVar1[uVar7] = ~puVar1[uVar7];
      uVar7 = uVar7 + 1;
      uVar10 = (this->G)._bitssize;
    } while (uVar7 < uVar10);
  }
  uVar7 = (this->G)._size & 0x3f;
  if (uVar7 != 0) {
    this_00->_bits[uVar10 - 1] = this_00->_bits[uVar10 - 1] & ~(-1L << uVar7);
  }
  pGVar15 = (this->super_Solver).game;
  puVar11 = (this->Q).queue;
  uVar10 = pGVar15->n_vertices;
  (this->Q).pointer = 0;
  if (puVar11 != (uint *)0x0) {
    operator_delete__(puVar11);
    pGVar15 = (this->super_Solver).game;
  }
  puVar11 = (uint *)operator_new__((uVar10 & 0xffffffff) << 2);
  (this->Q).queue = puVar11;
  uVar10 = pGVar15->n_vertices;
  (this->SolvedQ0).pointer = 0;
  puVar11 = (this->SolvedQ0).queue;
  if (puVar11 != (uint *)0x0) {
    operator_delete__(puVar11);
    pGVar15 = (this->super_Solver).game;
  }
  puVar11 = (uint *)operator_new__((uVar10 & 0xffffffff) << 2);
  (this->SolvedQ0).queue = puVar11;
  uVar10 = pGVar15->n_vertices;
  (this->SolvedQ1).pointer = 0;
  puVar11 = (this->SolvedQ1).queue;
  if (puVar11 != (uint *)0x0) {
    operator_delete__(puVar11);
    pGVar15 = (this->super_Solver).game;
  }
  puVar11 = (uint *)operator_new__((uVar10 & 0xffffffff) << 2);
  (this->SolvedQ1).queue = puVar11;
  uVar10 = pGVar15->n_vertices;
  (this->Zvec).pointer = 0;
  puVar11 = (this->Zvec).queue;
  if (puVar11 != (uint *)0x0) {
    operator_delete__(puVar11);
    pGVar15 = (this->super_Solver).game;
  }
  puVar11 = (uint *)operator_new__((uVar10 & 0xffffffff) << 2);
  (this->Zvec).queue = puVar11;
  uVar10 = pGVar15->n_vertices;
  (this->tangleto).pointer = 0;
  puVar11 = (this->tangleto).queue;
  if (puVar11 != (uint *)0x0) {
    operator_delete__(puVar11);
    pGVar15 = (this->super_Solver).game;
  }
  puVar11 = (uint *)operator_new__((uVar10 & 0xffffffff) << 2);
  (this->tangleto).queue = puVar11;
  bitset::resize(&this->bs_exits,pGVar15->n_vertices);
  pGVar15 = (this->super_Solver).game;
  puVar11 = (this->pea_vS).queue;
  uVar10 = pGVar15->n_vertices;
  (this->pea_vS).pointer = 0;
  if (puVar11 != (uint *)0x0) {
    operator_delete__(puVar11);
    pGVar15 = (this->super_Solver).game;
  }
  puVar11 = (uint *)operator_new__((uVar10 & 0xffffffff) << 2);
  (this->pea_vS).queue = puVar11;
  uVar10 = pGVar15->n_vertices;
  (this->pea_iS).pointer = 0;
  puVar11 = (this->pea_iS).queue;
  if (puVar11 != (uint *)0x0) {
    operator_delete__(puVar11);
    pGVar15 = (this->super_Solver).game;
  }
  puVar11 = (uint *)operator_new__((uVar10 & 0xffffffff) << 2);
  (this->pea_iS).queue = puVar11;
  uVar10 = pGVar15->n_vertices;
  (this->pea_S).pointer = 0;
  puVar11 = (this->pea_S).queue;
  if (puVar11 != (uint *)0x0) {
    operator_delete__(puVar11);
    pGVar15 = (this->super_Solver).game;
  }
  puVar11 = (uint *)operator_new__((uVar10 & 0xffffffff) << 2);
  (this->pea_S).queue = puVar11;
  uVar10 = 0xffffffffffffffff;
  if ((ulong)pGVar15->n_vertices < 0x4000000000000000) {
    uVar10 = pGVar15->n_vertices * 4;
  }
  puVar12 = (uint *)operator_new__(uVar10);
  this->pea_vidx = puVar12;
  bitset::resize(&this->pea_root,pGVar15->n_vertices);
  solve(this);
  poVar13 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"found ",6);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->dominions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," dominions.",0xb);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  poVar13 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"solved with ",0xc);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->tangles);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," tangles and ",0xd);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->iterations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," iterations.",0xc);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  uVar10 = ((this->super_Solver).game)->n_vertices;
  if (0 < (long)uVar10) {
    uVar7 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
        poVar13 = std::operator<<((this->super_Solver).logger,"search was incomplete!");
        std::endl<char,std::char_traits<char>>(poVar13);
        exit(-1);
      }
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
  }
  ppiVar2 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar17 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar17 != ppiVar2; ppiVar17 = ppiVar17 + 1) {
    if (*ppiVar17 != (int *)0x0) {
      operator_delete__(*ppiVar17);
    }
  }
  ppiVar2 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar17 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar17 != ppiVar2; ppiVar17 = ppiVar17 + 1) {
    if (*ppiVar17 != (int *)0x0) {
      operator_delete__(*ppiVar17);
    }
  }
  pvVar3 = this->tin;
  if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar4 = pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar18 = &pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar4 != (pointer)0x0) {
      lVar16 = (long)piVar4 * 0x18;
      do {
        pvVar5 = *(void **)((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar16);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)ppiVar18 + lVar16) - (long)pvVar5);
        }
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != 0);
    }
    operator_delete__(ppiVar18,(long)piVar4 * 0x18 + 8);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  if (this->pea_vidx == (uint *)0x0) {
    return;
  }
  operator_delete__(this->pea_vidx);
  return;
}

Assistant:

void
PTLSolver::run()
{
    iterations = 0;
    dominions = 0;
    tangles = 0;

    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    H.resize(nodecount());
    S0.resize(nodecount());
    S1.resize(nodecount());
    G = disabled;
    G.flip();

    Q.resize(nodecount());
    SolvedQ0.resize(nodecount());
    SolvedQ1.resize(nodecount());
    Zvec.resize(nodecount());
    tangleto.resize(nodecount());
    bs_exits.resize(nodecount());

    pea_vS.resize(nodecount());
    pea_iS.resize(nodecount());
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    solve();

    logger << "found " << dominions << " dominions." << std::endl;
    logger << "solved with " << tangles << " tangles and " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { logger << "search was incomplete!" << std::endl; exit(-1); }
    }
#endif

    // delete[] tangles
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
}